

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O2

char * password_hash(char *password,char *algo,char *salt,int cost)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  ssize_t sVar6;
  ushort **ppuVar7;
  char *__s;
  char *pcVar8;
  time_t tVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  size_t sStack_50;
  char format [10];
  
  if (password == (char *)0x0) {
    if (msgno < 0) {
      return (char *)0x0;
    }
    pcVar5 = "password_hash: missing password\n";
    sStack_50 = 0x20;
    goto LAB_001017e1;
  }
  if (cost - 0x20U < 0xffffffe4) {
    if (msgno < 0) {
      return (char *)0x0;
    }
    fprintf(_stderr,"password_hash: invalid bcrypt cost parameter specified: %d\n",(ulong)(uint)cost
           );
    return (char *)0x0;
  }
  if (salt == (char *)0x0) {
    pcVar5 = (char *)calloc(1,0x17);
    if (pcVar5 == (char *)0x0) {
      if (msgno < 0) {
        return (char *)0x0;
      }
      fwrite("password_hash: memory allocate\n",0x1f,1,_stderr);
    }
    else {
      iVar2 = open("/dev/urandom",0);
      if (iVar2 < 0) {
LAB_0010177c:
        tVar9 = time((time_t *)0x0);
        srand((uint)tVar9);
        for (lVar12 = 0; lVar12 != 0x11; lVar12 = lVar12 + 1) {
          iVar2 = rand();
          pcVar5[lVar12] = pcVar5[lVar12] ^ (byte)(int)(((double)iVar2 * 255.0) / 2147483647.0);
        }
      }
      else {
        for (uVar11 = 0; uVar11 < 0x11; uVar11 = uVar11 + ((uint)sVar6 & 0x7fffffff)) {
          sVar6 = read(iVar2,pcVar5 + uVar11,0x11 - uVar11);
          if ((int)(uint)sVar6 < 0) {
            close(iVar2);
            goto LAB_0010177c;
          }
        }
        close(iVar2);
      }
      uVar3 = to_base64(pcVar5,0x11,0x16);
      if (-1 < (int)uVar3) goto LAB_00101615;
      free(pcVar5);
    }
    if (msgno < 1) {
      return (char *)0x0;
    }
    pcVar5 = "password_hash: generated salt\n";
    sStack_50 = 0x1e;
  }
  else {
    sVar4 = strlen(salt);
    pcVar5 = (char *)malloc(sVar4 + 1);
    if (pcVar5 != (char *)0x0) {
      memcpy(pcVar5,salt,sVar4);
      pcVar5[sVar4] = '\0';
      if (sVar4 < 0x16) {
        free(pcVar5);
        if (msgno < 1) {
          return (char *)0x0;
        }
        fprintf(_stderr,"password_hash: provided salt is too short: %ld expecting %ld\n",sVar4,0x16)
        ;
        return (char *)0x0;
      }
      ppuVar7 = __ctype_b_loc();
      sVar10 = 0;
      do {
        if (sVar4 == sVar10) goto LAB_00101627;
        pbVar1 = (byte *)(pcVar5 + sVar10);
        sVar10 = sVar10 + 1;
      } while (((*pbVar1 & 0xfe) == 0x2e) || (((*ppuVar7)[(char)*pbVar1] & 8) != 0));
      uVar3 = to_base64(pcVar5,sVar4,sVar4);
      if ((int)uVar3 < 0) {
        free(pcVar5);
        if (msgno < 1) {
          return (char *)0x0;
        }
        pcVar5 = "password_hash: provided salt is not alphabet\n";
        sStack_50 = 0x2d;
        goto LAB_001017e1;
      }
LAB_00101615:
      pcVar5[uVar3] = '\0';
      sVar4 = strlen(pcVar5);
LAB_00101627:
      if (0 < msgno) {
        fprintf(_stderr,
                "password_hash: parameters\n  password  => %s\n  algorithm => %s\n  salt      => %s\n  cost      => %d\n"
                ,password,algo,pcVar5,(ulong)(uint)cost);
      }
      format[8] = '\0';
      format[9] = '\0';
      format[0] = '\0';
      format[1] = '\0';
      format[2] = '\0';
      format[3] = '\0';
      format[4] = '\0';
      format[5] = '\0';
      format[6] = '\0';
      format[7] = '\0';
      sprintf(format,"$2y$%02d$",(ulong)(uint)cost);
      sVar10 = strlen(format);
      __s = (char *)malloc(sVar10 + sVar4 + 1);
      if (__s == (char *)0x0) {
        if (0 < msgno) {
          fwrite("password_hash: memory allocate\n",0x1f,1,_stderr);
        }
        free(pcVar5);
        return (char *)0x0;
      }
      sprintf(__s,"%s%s",format,pcVar5);
      __s[sVar10 + sVar4] = '\0';
      free(pcVar5);
      if (1 < msgno) {
        fprintf(_stderr,"password_hash: hash => %s\n",__s);
      }
      pcVar5 = (char *)calloc(1,0x3d);
      if (pcVar5 != (char *)0x0) {
        pcVar8 = _crypt_blowfish_rn(password,__s,pcVar5,0x3d);
        free(__s);
        if (pcVar8 == (char *)0x0) {
          free(pcVar5);
          if (msgno < 1) {
            return (char *)0x0;
          }
          pcVar5 = "password_hash: blowfish run.\n";
          sStack_50 = 0x1d;
        }
        else {
          sVar4 = strlen(pcVar5);
          if (0xd < sVar4) {
            return pcVar5;
          }
          free(pcVar5);
          if (msgno < 1) {
            return (char *)0x0;
          }
          pcVar5 = "password_hash: hash length.\n";
          sStack_50 = 0x1c;
        }
        goto LAB_001017e1;
      }
      free(__s);
    }
    if (msgno < 1) {
      return (char *)0x0;
    }
    pcVar5 = "password_hash: memory allocate\n";
    sStack_50 = 0x1f;
  }
LAB_001017e1:
  fwrite(pcVar5,sStack_50,1,_stderr);
  return (char *)0x0;
}

Assistant:

char *
password_hash(const char *password, const char *algo,
              const char *salt, const int cost)
{
    char *gensalt = NULL, *hash = NULL, *output = NULL;
    char format[FORMAT_LEN];
    size_t output_len = BLOWFISH_LEN + 1;
    size_t salt_required_len = BCRYPT_BLOWFISH_SALT_REQUIRED_LEN;
    size_t format_len, salt_len;

    if (!password) {
        msg_error(hash, "missing password\n");
        return NULL;
    }

    if (cost < 4 || cost > 31) {
        msg_error(hash, "invalid bcrypt cost parameter specified: %d\n", cost);
        return NULL;
    }

    if (salt) {
        salt_len = strlen(salt);
        gensalt = (char *)malloc(salt_len + 1);
        if (!gensalt) {
            msg_verbose(hash, "memory allocate\n");
            return NULL;
        }
        memcpy(gensalt, salt, salt_len);
        gensalt[salt_len] = 0;

        if (salt_len < salt_required_len) {
            free(gensalt);
            msg_verbose(hash, "provided salt is too short: %ld expecting %ld\n",
                        salt_len, salt_required_len);
            return NULL;
        } else if (is_alphabet(gensalt, salt_len) < 0) {
            int len = to_base64(gensalt, salt_len, salt_len);
            if (len < 0) {
                free(gensalt);
                msg_verbose(hash, "provided salt is not alphabet\n");
                return NULL;
            }
            gensalt[len] = 0;
            salt_len = strlen(gensalt);
        }
    } else {
        gensalt = make_salt(salt_required_len);
        if (!gensalt) {
            msg_verbose(hash, "generated salt\n");
            return NULL;
        }
        salt_len = strlen(gensalt);
    }

    msg_verbose(hash,"parameters\n"
                "  password  => %s\n"
                "  algorithm => %s\n"
                "  salt      => %s\n"
                "  cost      => %d\n",
                password, algo, gensalt, cost);

    memset(format, 0, sizeof(format));
    sprintf(format, "$2y$%02d$", cost);
    format_len = strlen(format);

    hash = malloc(format_len + salt_len + 1);
    if (!hash) {
        msg_verbose(hash, "memory allocate\n");
        free(gensalt);
        return NULL;
    }

    sprintf(hash, "%s%s", format, gensalt);
    hash[format_len + salt_len] = 0;

    free(gensalt);

    msg_verbose_ex(hash, 2, "hash => %s\n", hash);

    output = malloc(output_len);
    if (!output) {
        free(hash);
        msg_verbose(hash, "memory allocate\n");
        return NULL;
    }

    memset(output, 0, output_len);

    if (_crypt_blowfish_rn(password, hash, output, output_len) == NULL) {
        free(hash);
        free(output);
        msg_verbose(hash, "blowfish run.\n");
        return NULL;
    }

    free(hash);

    if (strlen(output) <= 13) {
        free(output);
        msg_verbose(hash, "hash length.\n");
        return NULL;
    }

    return output;
}